

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cpp
# Opt level: O0

Time * Time::fromLocal(Time *__return_storage_ptr__,LocalTime *time)

{
  long second;
  long usecond;
  LocalTime *time_local;
  
  second = Time::Second(&time->super_Time);
  usecond = Time::microSecond(&time->super_Time);
  Time::Time(__return_storage_ptr__,second,usecond);
  return __return_storage_ptr__;
}

Assistant:

Time fromLocal(const LocalTime & time)
    {
/*
        struct tm tmt;
        // The LocalTime class store its time as number of second since Epoch + (unknown) local offset.
        makeUTCTime((time_t)time.Second(), tmt);
        tmt.tm_isdst = -1; // Force detection of the DST rule in place at that time
        return Time(makeTime(&tmt), time.microSecond());
        */
        return Time(time.Second(), time.microSecond());
    }